

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
IteratorTest_CountingIterator_Test::TestBody(IteratorTest_CountingIterator_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  counting_iterator<char> cVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  counting_iterator<char> prev;
  counting_iterator<char> it;
  counting_iterator<char> *in_stack_ffffffffffffff18;
  AssertHelper *in_stack_ffffffffffffff20;
  unsigned_long *in_stack_ffffffffffffff28;
  AssertionResult *pAVar4;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  char *in_stack_ffffffffffffff38;
  int line;
  counting_iterator<char> *this_01;
  Type type;
  undefined7 in_stack_ffffffffffffff50;
  AssertionResult local_88 [2];
  Message *in_stack_ffffffffffffff98;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertionResult local_48;
  size_t local_38;
  char local_30;
  counting_iterator<char> local_28;
  counting_iterator<char> local_18;
  
  this_01 = &local_18;
  fmt::v5::internal::counting_iterator<char>::counting_iterator(this_01);
  cVar3 = fmt::v5::internal::counting_iterator<char>::operator++(in_stack_ffffffffffffff18,0);
  local_38 = cVar3.count_;
  local_30 = cVar3.blackhole_;
  local_28.count_ = local_38;
  local_28.blackhole_ = local_30;
  fmt::v5::internal::counting_iterator<char>::count(&local_28);
  pAVar4 = &local_48;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_ffffffffffffff38,
             (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,(int *)in_stack_ffffffffffffff20);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  type = (Type)((ulong)pAVar4 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff50));
    in_stack_ffffffffffffff38 =
         testing::AssertionResult::failure_message((AssertionResult *)0x121ddb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff50),type,(char *)this_01,
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff20);
    testing::Message::~Message((Message *)0x121e29);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x121e78);
  fmt::v5::internal::counting_iterator<char>::count(&local_18);
  pAVar4 = local_88;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_ffffffffffffff38,
             (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             (unsigned_long *)pAVar4,(int *)in_stack_ffffffffffffff20);
  line = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff50));
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x121f19)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff50),type,(char *)this_01,line,
               (char *)CONCAT17(uVar2,in_stack_ffffffffffffff30));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x121f67);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x121fb3);
  return;
}

Assistant:

TEST(IteratorTest, CountingIterator) {
  fmt::internal::counting_iterator<char> it;
  auto prev = it++;
  EXPECT_EQ(prev.count(), 0);
  EXPECT_EQ(it.count(), 1);
}